

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderApiTests.cpp
# Opt level: O2

void __thiscall deqp::gles2::Functional::ProgramStateCase::test(ProgramStateCase *this)

{
  size_type *this_00;
  TestLog *log;
  RenderContext *renderCtx;
  TestLog *log_00;
  Shader *this_01;
  Shader *this_02;
  ShaderAllocator *shaders_00;
  char *__to;
  char *__from;
  uchar *in_R8;
  size_t in_R9;
  Program program;
  ShaderAllocator shaders;
  ConstantShaderGenerator sourceGen;
  ProgramInfo programInfo;
  
  log = ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
  renderCtx = ((this->super_ApiCase).super_TestCase.m_context)->m_renderCtx;
  shaders.m_srcGen = &sourceGen.super_SourceGenerator;
  sourceGen.super_SourceGenerator._vptr_SourceGenerator =
       (_func_int **)&PTR__ConstantShaderGenerator_01e19148;
  sourceGen.m_rnd.m_rnd.x = (this->m_rnd).m_rnd.x;
  sourceGen.m_rnd.m_rnd.y = (this->m_rnd).m_rnd.y;
  sourceGen.m_rnd.m_rnd.z = (this->m_rnd).m_rnd.z;
  sourceGen.m_rnd.m_rnd.w = (this->m_rnd).m_rnd.w;
  shaders.m_shaders._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &shaders.m_shaders._M_t._M_impl.super__Rb_tree_header._M_header;
  shaders.m_shaders._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  shaders.m_shaders._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  shaders.m_shaders._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  shaders.m_context = renderCtx;
  shaders.m_shaders._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       shaders.m_shaders._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  glu::Program::Program(&program,renderCtx);
  log_00 = ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
  this_01 = Functional::anon_unknown_0::ShaderAllocator::createShader(&shaders,SHADERTYPE_VERTEX);
  this_02 = Functional::anon_unknown_0::ShaderAllocator::createShader(&shaders,SHADERTYPE_FRAGMENT);
  glu::Shader::compile(this_01);
  glu::Shader::compile(this_02);
  glu::Program::attachShader(&program,this_01->m_shader);
  __from = (char *)(ulong)this_02->m_shader;
  glu::Program::attachShader(&program,this_02->m_shader);
  glu::Program::link(&program,__from,__to);
  shaders_00 = &shaders;
  Functional::anon_unknown_0::logProgram
            (log_00,((this->super_ApiCase).super_TestCase.m_context)->m_renderCtx,&program,
             shaders_00);
  if (program.m_info.linkOk == true) {
    glu::ProgramInfo::ProgramInfo(&programInfo,&program.m_info);
    (*(this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode[6])
              (this,&program,&shaders);
    verify(this,(EVP_PKEY_CTX *)&program,(uchar *)&programInfo,(size_t)shaders_00,in_R8,in_R9);
    Functional::anon_unknown_0::logProgram(log,renderCtx,&program,&shaders);
    std::__cxx11::string::~string((string *)&programInfo);
  }
  else {
    this_00 = &programInfo.infoLog._M_string_length;
    programInfo.infoLog._M_dataplus._M_p = (pointer)log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
    std::operator<<((ostream *)this_00,"Fail, couldn\'t link program.");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&programInfo,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
    tcu::TestContext::setTestResult
              ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_FAIL,"Linking failed");
  }
  glu::Program::~Program(&program);
  Functional::anon_unknown_0::ShaderAllocator::~ShaderAllocator(&shaders);
  return;
}

Assistant:

void ProgramStateCase::test (void)
{
	TestLog&				log			= m_testCtx.getLog();
	glu::RenderContext&		renderCtx	= m_context.getRenderContext();

	ConstantShaderGenerator	sourceGen	(m_rnd);

	ShaderAllocator			shaders		(renderCtx, sourceGen);
	glu::Program			program		(renderCtx);

	buildProgram(program, shaders);

	if (program.getLinkStatus())
	{
		glu::ProgramInfo programInfo = program.getInfo();

		executeForProgram(program, shaders);

		verify(program, programInfo);

		logProgram(log, renderCtx, program, shaders);
	}
	else
	{
		log << TestLog::Message << "Fail, couldn't link program." << TestLog::EndMessage;
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Linking failed");
	}
}